

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall
mkvmuxer::Segment::AddVideoTrack(Segment *this,int32_t width,int32_t height,int32_t number)

{
  bool bVar1;
  VideoTrack *this_00;
  
  this_00 = (VideoTrack *)operator_new(0xf8,(nothrow_t *)&std::nothrow);
  if (this_00 == (VideoTrack *)0x0) {
    this_00 = (VideoTrack *)0x0;
  }
  else {
    VideoTrack::VideoTrack(this_00,&this->seed_);
  }
  if (this_00 != (VideoTrack *)0x0) {
    (this_00->super_Track).type_ = 1;
    Track::set_codec_id(&this_00->super_Track,"V_VP8");
    this_00->width_ = (long)width;
    this_00->height_ = (long)height;
    bVar1 = Tracks::AddTrack(&this->tracks_,&this_00->super_Track,number);
    if (bVar1) {
      this->has_video_ = true;
      return (this_00->super_Track).number_;
    }
    (*(this_00->super_Track)._vptr_Track[1])(this_00);
  }
  return 0;
}

Assistant:

uint64_t Segment::AddVideoTrack(int32_t width, int32_t height, int32_t number) {
  VideoTrack* const track = new (std::nothrow) VideoTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kVideo);
  track->set_codec_id(Tracks::kVp8CodecId);
  track->set_width(width);
  track->set_height(height);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }
  has_video_ = true;

  return track->number();
}